

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeAlign.cpp
# Opt level: O3

void __thiscall wasm::DeAlign::~DeAlign(DeAlign *this)

{
  pointer pTVar1;
  
  pTVar1 = (this->
           super_WalkerPass<wasm::PostWalker<wasm::DeAlign,_wasm::Visitor<wasm::DeAlign,_void>_>_>).
           super_PostWalker<wasm::DeAlign,_wasm::Visitor<wasm::DeAlign,_void>_>.
           super_Walker<wasm::DeAlign,_wasm::Visitor<wasm::DeAlign,_void>_>.stack.flexible.
           super__Vector_base<wasm::Walker<wasm::DeAlign,_wasm::Visitor<wasm::DeAlign,_void>_>::Task,_std::allocator<wasm::Walker<wasm::DeAlign,_wasm::Visitor<wasm::DeAlign,_void>_>::Task>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pTVar1 != (pointer)0x0) {
    operator_delete(pTVar1,(long)*(pointer *)
                                  ((long)&(this->
                                          super_WalkerPass<wasm::PostWalker<wasm::DeAlign,_wasm::Visitor<wasm::DeAlign,_void>_>_>
                                          ).
                                          super_PostWalker<wasm::DeAlign,_wasm::Visitor<wasm::DeAlign,_void>_>
                                          .
                                          super_Walker<wasm::DeAlign,_wasm::Visitor<wasm::DeAlign,_void>_>
                                          .stack.flexible.
                                          super__Vector_base<wasm::Walker<wasm::DeAlign,_wasm::Visitor<wasm::DeAlign,_void>_>::Task,_std::allocator<wasm::Walker<wasm::DeAlign,_wasm::Visitor<wasm::DeAlign,_void>_>::Task>_>
                                          ._M_impl + 0x10) - (long)pTVar1);
  }
  Pass::~Pass((Pass *)this);
  operator_delete(this,0x130);
  return;
}

Assistant:

std::unique_ptr<Pass> create() override {
    return std::make_unique<DeAlign>();
  }